

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Position __thiscall AI::turn(AI *this,Position *other)

{
  Position PVar1;
  const_reference this_00;
  const_reference pvVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  Position *other_local;
  AI *this_local;
  Position preferedPos;
  
  memset(&this_local,0,8);
  local_24 = 0;
  do {
    if (0xe < local_24) {
LAB_00104a12:
      PVar1.y = this_local._4_4_;
      PVar1.x = (int)this_local;
      return PVar1;
    }
    for (local_28 = 0; local_28 < 0xf; local_28 = local_28 + 1) {
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](this->board,(long)local_24);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_28);
      if (*pvVar2 == 0) {
        this_local._0_4_ = local_24;
        this_local._4_4_ = local_28;
        goto LAB_00104a12;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Position AI::turn(const Position &other) {
    /*
     * TODO: Write your own ai here!
     * Here is a simple AI which just put chess at empty position!
     * 代做：在这里写下你的AI。
     * 这里有一个示例AI，它只会寻找第一个可下的位置进行落子。
     */
    int i, j;
    Position preferedPos = {0, 0};

    for (i = 0; i < BOARD_SIZE; i++) {
        for (j = 0; j < BOARD_SIZE; j++) {
            if (EMPTY == board[i][j]) {
                preferedPos.x = i;
                preferedPos.y = j;
                return preferedPos;
            }
        }
    }

    return preferedPos;
}